

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# knownhost.c
# Opt level: O2

int knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,char *hostp,int port,char *key,size_t keylen,
                   int typemask,libssh2_knownhost **ext)

{
  short sVar1;
  uint uVar2;
  int iVar3;
  size_t sVar4;
  known_host *node;
  HMAC_CTX *ctx;
  EVP_MD *md;
  size_t len;
  libssh2_knownhost *plVar5;
  char *pcVar6;
  uint uVar7;
  LIBSSH2_SESSION *session;
  ulong uVar8;
  uchar *data;
  int host_key_type;
  bool bVar9;
  char *local_1a0;
  known_host *local_198;
  char *keyalloc;
  uint local_188;
  uint local_184;
  LIBSSH2_KNOWNHOSTS *local_180;
  list_head *local_178;
  uchar *local_170;
  uchar hash [20];
  char hostbuff [270];
  
  uVar7 = typemask & 0xffff;
  keyalloc = (char *)0x0;
  if (uVar7 == 2) {
    return 1;
  }
  data = (uchar *)hostp;
  local_170 = (uchar *)hostp;
  if (port < 0) {
LAB_00118657:
    local_1a0 = key;
    if (((uint)typemask >> 0x11 & 1) == 0) {
      sVar4 = _libssh2_base64_encode(hosts->session,key,keylen,&keyalloc);
      if (sVar4 == 0) {
        session = hosts->session;
        pcVar6 = "Unable to allocate memory for base64-encoded key";
        iVar3 = -6;
        goto LAB_0011886b;
      }
      local_1a0 = keyalloc;
    }
    uVar8 = (ulong)((uint)port >> 0x1f);
    local_178 = &hosts->head;
    uVar2 = typemask & 0x3c0000;
    local_198 = (known_host *)0x0;
    local_188 = uVar7;
    local_180 = hosts;
    do {
      local_184 = (uint)uVar8;
      for (node = (known_host *)_libssh2_list_first(local_178); node != (known_host *)0x0;
          node = (known_host *)_libssh2_list_next(&node->node)) {
        sVar1 = (short)node->typemask;
        if (sVar1 == 3) {
          if (uVar7 == 3) {
LAB_00118796:
            iVar3 = strcmp((char *)data,node->name);
LAB_001187a2:
            bVar9 = iVar3 == 0;
LAB_001187a9:
            if ((bVar9) &&
               ((uVar2 == 0 || ((uVar2 != 0x3c0000 && (uVar2 == (node->typemask & 0x3c0000U))))))) {
              iVar3 = strcmp(local_1a0,node->key);
              if (iVar3 == 0) {
                iVar3 = 0;
                local_198 = node;
                goto LAB_00118822;
              }
              if (local_198 == (known_host *)0x0) {
                local_198 = node;
              }
            }
          }
        }
        else if (sVar1 == 2) {
          if (uVar7 == 1) {
            ctx = (HMAC_CTX *)HMAC_CTX_new();
            bVar9 = false;
            if (node->name_len == 0x14) {
              pcVar6 = node->salt;
              sVar4 = node->salt_len;
              md = EVP_sha1();
              uVar7 = local_188;
              uVar8 = 0;
              HMAC_Init_ex(ctx,pcVar6,(int)sVar4,md,(ENGINE *)0x0);
              len = strlen((char *)data);
              HMAC_Update(ctx,data,len);
              HMAC_Final(ctx,hash,(uint *)0x0);
              HMAC_CTX_free(ctx);
              iVar3 = bcmp(hash,node->name,0x14);
              goto LAB_001187a2;
            }
            goto LAB_001187a9;
          }
        }
        else if ((sVar1 == 1) && (uVar7 == 1)) goto LAB_00118796;
      }
      uVar8 = CONCAT71((int7)(uVar8 >> 8),1);
      data = local_170;
    } while ((local_184 & 1) == 0);
    if (local_198 == (known_host *)0x0) {
      iVar3 = 2;
    }
    else {
      iVar3 = 1;
LAB_00118822:
      if (ext != (libssh2_knownhost **)0x0) {
        plVar5 = knownhost_to_external(local_198);
        *ext = plVar5;
      }
    }
    if (keyalloc != (char *)0x0) {
      (*local_180->session->free)(keyalloc,&local_180->session->abstract);
    }
  }
  else {
    data = (uchar *)hostbuff;
    uVar2 = snprintf((char *)data,0x10e,"[%s]:%d");
    if (uVar2 < 0x10e) goto LAB_00118657;
    session = hosts->session;
    pcVar6 = "Known-host write buffer too small";
    iVar3 = -0x26;
LAB_0011886b:
    _libssh2_error(session,iVar3,pcVar6);
    iVar3 = 3;
  }
  return iVar3;
}

Assistant:

static int
knownhost_check(LIBSSH2_KNOWNHOSTS *hosts,
                const char *hostp, int port,
                const char *key, size_t keylen,
                int typemask,
                struct libssh2_knownhost **ext)
{
    struct known_host *node;
    struct known_host *badkey = NULL;
    int type = typemask & LIBSSH2_KNOWNHOST_TYPE_MASK;
    char *keyalloc = NULL;
    int rc = LIBSSH2_KNOWNHOST_CHECK_NOTFOUND;
    char hostbuff[270]; /* most host names can't be longer than like 256 */
    const char *host;
    int numcheck; /* number of host combos to check */
    int match = 0;

    if(type == LIBSSH2_KNOWNHOST_TYPE_SHA1)
        /* we can't work with a sha1 as given input */
        return LIBSSH2_KNOWNHOST_CHECK_MISMATCH;

    /* if a port number is given, check for a '[host]:port' first before the
       plain 'host' */
    if(port >= 0) {
        int len = snprintf(hostbuff, sizeof(hostbuff), "[%s]:%d", hostp, port);
        if(len < 0 || len >= (int)sizeof(hostbuff)) {
            _libssh2_error(hosts->session,
                           LIBSSH2_ERROR_BUFFER_TOO_SMALL,
                           "Known-host write buffer too small");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }
        host = hostbuff;
        numcheck = 2; /* check both combos, start with this */
    }
    else {
        host = hostp;
        numcheck = 1; /* only check this host version */
    }

    if(!(typemask & LIBSSH2_KNOWNHOST_KEYENC_BASE64)) {
        /* we got a raw key input, convert it to base64 for the checks below */
        size_t nlen = _libssh2_base64_encode(hosts->session, key, keylen,
                                             &keyalloc);
        if(!nlen) {
            _libssh2_error(hosts->session, LIBSSH2_ERROR_ALLOC,
                           "Unable to allocate memory for base64-encoded "
                           "key");
            return LIBSSH2_KNOWNHOST_CHECK_FAILURE;
        }

        /* make the key point to this */
        key = keyalloc;
    }

    do {
        node = _libssh2_list_first(&hosts->head);
        while(node) {
            switch(node->typemask & LIBSSH2_KNOWNHOST_TYPE_MASK) {
            case LIBSSH2_KNOWNHOST_TYPE_PLAIN:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_CUSTOM:
                if(type == LIBSSH2_KNOWNHOST_TYPE_CUSTOM)
                    match = !strcmp(host, node->name);
                break;
            case LIBSSH2_KNOWNHOST_TYPE_SHA1:
                if(type == LIBSSH2_KNOWNHOST_TYPE_PLAIN) {
                    /* when we have the sha1 version stored, we can use a
                       plain input to produce a hash to compare with the
                       stored hash.
                    */
                    unsigned char hash[SHA_DIGEST_LENGTH];
                    libssh2_hmac_ctx ctx;
                    libssh2_hmac_ctx_init(ctx);

                    if(SHA_DIGEST_LENGTH != node->name_len) {
                        /* the name hash length must be the sha1 size or
                           we can't match it */
                        break;
                    }
                    libssh2_hmac_sha1_init(&ctx, (unsigned char *)node->salt,
                                           node->salt_len);
                    libssh2_hmac_update(ctx, (unsigned char *)host,
                                        strlen(host));
                    libssh2_hmac_final(ctx, hash);
                    libssh2_hmac_cleanup(&ctx);

                    if(!memcmp(hash, node->name, SHA_DIGEST_LENGTH))
                        /* this is a node we're interested in */
                        match = 1;
                }
                break;
            default: /* unsupported type */
                break;
            }
            if(match) {
                int host_key_type = typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                int known_key_type =
                    node->typemask & LIBSSH2_KNOWNHOST_KEY_MASK;
                /* match on key type as follows:
                   - never match on an unknown key type
                   - if key_type is set to zero, ignore it an match always
                   - otherwise match when both key types are equal
                */
                if(host_key_type != LIBSSH2_KNOWNHOST_KEY_UNKNOWN &&
                     (host_key_type == 0 ||
                      host_key_type == known_key_type)) {
                    /* host name and key type match, now compare the keys */
                    if(!strcmp(key, node->key)) {
                        /* they match! */
                        if(ext)
                            *ext = knownhost_to_external(node);
                        badkey = NULL;
                        rc = LIBSSH2_KNOWNHOST_CHECK_MATCH;
                        break;
                    }
                    else {
                        /* remember the first node that had a host match but a
                           failed key match since we continue our search from
                           here */
                        if(!badkey)
                            badkey = node;
                    }
                }
                match = 0; /* don't count this as a match anymore */
            }
            node = _libssh2_list_next(&node->node);
        }
        host = hostp;
    } while(!match && --numcheck);

    if(badkey) {
        /* key mismatch */
        if(ext)
            *ext = knownhost_to_external(badkey);
        rc = LIBSSH2_KNOWNHOST_CHECK_MISMATCH;
    }

    if(keyalloc)
        LIBSSH2_FREE(hosts->session, keyalloc);

    return rc;
}